

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

void __thiscall QWidget::lower(QWidget *this)

{
  long lVar1;
  long *plVar2;
  QWidgetPrivate *this_00;
  long lVar3;
  long lVar4;
  long lVar5;
  QWExtra *pQVar6;
  long lVar7;
  int iVar8;
  long unaff_R12;
  long in_FS_OFFSET;
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidgetPrivate **)&this->field_0x8;
  if (((this->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
       super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) {
    lVar3 = *(long *)&this_00->field_0x10;
    lVar4 = *(long *)(lVar3 + 8);
    lVar5 = *(long *)(lVar4 + 0x28);
    if ((int)lVar5 < 2) goto LAB_0030f787;
    if (lVar5 == 0) {
LAB_0030f6e4:
      iVar8 = -1;
    }
    else {
      lVar7 = -8;
      do {
        iVar8 = (int)unaff_R12;
        lVar1 = lVar5 * -8 + lVar7;
        if (lVar1 == -8) goto LAB_0030f6de;
        unaff_R12 = lVar7 + 8;
        plVar2 = (long *)(*(long *)(lVar4 + 0x20) + 8 + lVar7);
        lVar7 = unaff_R12;
      } while ((QWidget *)*plVar2 != this);
      iVar8 = (int)(unaff_R12 >> 3);
LAB_0030f6de:
      if (lVar1 == -8) goto LAB_0030f6e4;
    }
    if (iVar8 != 0) {
      QList<QObject_*>::move((QList<QObject_*> *)(lVar4 + 0x18),(long)iVar8,0);
    }
    if (((*(byte *)(*(long *)&this->field_0x8 + 0x243) & 0x10) == 0) &&
       ((*(byte *)(*(long *)(lVar3 + 8) + 0x243) & 0x10) != 0)) {
      create(this,0,false,false);
    }
    else if (iVar8 == 0) goto LAB_0030f787;
  }
  if ((*(byte *)(*(long *)&this->field_0x8 + 0x243) & 0x10) != 0) {
    QWidgetPrivate::lower_sys(this_00);
  }
  pQVar6 = (this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
           super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
           super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
  if ((pQVar6 != (QWExtra *)0x0) && ((pQVar6->field_0x7d & 1) != 0)) {
    QWindowContainer::parentWasLowered(this);
  }
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  QEvent::QEvent((QEvent *)&local_38,ZOrderChange);
  QCoreApplication::sendEvent(&this->super_QObject,(QEvent *)&local_38);
  QEvent::~QEvent((QEvent *)&local_38);
LAB_0030f787:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidget::lower()
{
    Q_D(QWidget);
    if (!isWindow()) {
        QWidget *p = parentWidget();
        const int parentChildCount = p->d_func()->children.size();
        if (parentChildCount < 2)
            return;
        const int from = p->d_func()->children.indexOf(this);
        Q_ASSERT(from >= 0);
        // Do nothing if the widget is already in correct stacking order _and_ created.
        if (from != 0)
            p->d_func()->children.move(from, 0);
        if (!testAttribute(Qt::WA_WState_Created) && p->testAttribute(Qt::WA_WState_Created))
            create();
        else if (from == 0)
            return;
    }
    if (testAttribute(Qt::WA_WState_Created))
        d->lower_sys();

    if (d->extra && d->extra->hasWindowContainer)
        QWindowContainer::parentWasLowered(this);

    QEvent e(QEvent::ZOrderChange);
    QCoreApplication::sendEvent(this, &e);
}